

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Meteomatics_Internals.h
# Opt level: O1

bool __thiscall
MeteomaticsApiClient::getMultiPointTimeSeries
          (MeteomaticsApiClient *this,string *startTime,string *stopTime,string *timeStep,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters,vector<double,_std::allocator<double>_> *lats,
          vector<double,_std::allocator<double>_> *lons,
          vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
          *result,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *times,string *msg,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *optionals)

{
  double *pdVar1;
  size_type *psVar2;
  uint uVar3;
  pointer *ppcVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *pvVar6;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *pvVar7;
  HttpClient *this_00;
  int iVar8;
  MeteomaticsApiClient *this_01;
  long *plVar9;
  undefined8 *puVar10;
  long *plVar11;
  ulong *puVar12;
  vector<double,_std::allocator<double>_> *lons_00;
  size_t sVar13;
  ulong uVar14;
  pointer pdVar15;
  pointer pcVar16;
  undefined8 uVar17;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *this_02;
  MemoryClass mem;
  int httpReturnCode;
  string queryString;
  string local_208;
  MemoryClass local_1e8;
  vector<double,_std::allocator<double>_> *local_1c8;
  long local_1c0;
  vector<double,_std::allocator<double>_> local_1b8;
  undefined8 local_1a0;
  double local_198;
  undefined8 uStack_190;
  string local_188;
  ulong *local_168;
  long local_160;
  ulong local_158;
  long lStack_150;
  MeteomaticsApiClient *local_148;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_140;
  string *local_138;
  string local_130;
  string local_110;
  string local_f0;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pvVar6 = (result->
           super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pvVar7 = (result->
           super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  this_02 = pvVar6;
  local_148 = this;
  local_140 = parameters;
  local_138 = timeStep;
  if (pvVar7 != pvVar6) {
    do {
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::~vector(this_02);
      this_02 = this_02 + 1;
    } while (this_02 != pvVar7);
    (result->
    super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = pvVar6;
  }
  msg->_M_string_length = 0;
  *(msg->_M_dataplus)._M_p = '\0';
  std::operator+(&local_50,"/",startTime);
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_d0 = &local_c0;
  plVar11 = plVar9 + 2;
  if ((long *)*plVar9 == plVar11) {
    local_c0 = *plVar11;
    lStack_b8 = plVar9[3];
  }
  else {
    local_c0 = *plVar11;
    local_d0 = (long *)*plVar9;
  }
  local_c8 = plVar9[1];
  *plVar9 = (long)plVar11;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  plVar9 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_d0,(ulong)(stopTime->_M_dataplus)._M_p);
  plVar11 = plVar9 + 2;
  if ((long *)*plVar9 == plVar11) {
    local_a0 = *plVar11;
    lStack_98 = plVar9[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *plVar11;
    local_b0 = (long *)*plVar9;
  }
  local_a8 = plVar9[1];
  *plVar9 = (long)plVar11;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_b0);
  plVar11 = plVar9 + 2;
  if ((long *)*plVar9 == plVar11) {
    local_80 = *plVar11;
    lStack_78 = plVar9[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar11;
    local_90 = (long *)*plVar9;
  }
  local_88 = plVar9[1];
  *plVar9 = (long)plVar11;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  plVar9 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_90,(ulong)(local_138->_M_dataplus)._M_p);
  plVar11 = plVar9 + 2;
  if ((long *)*plVar9 == plVar11) {
    local_60 = *plVar11;
    lStack_58 = plVar9[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar11;
    local_70 = (long *)*plVar9;
  }
  local_68 = plVar9[1];
  *plVar9 = (long)plVar11;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_70);
  puVar12 = (ulong *)(plVar9 + 2);
  if ((ulong *)*plVar9 == puVar12) {
    local_158 = *puVar12;
    lStack_150 = plVar9[3];
    local_168 = &local_158;
  }
  else {
    local_158 = *puVar12;
    local_168 = (ulong *)*plVar9;
  }
  local_160 = plVar9[1];
  *plVar9 = (long)puVar12;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  createParameterListString(&local_f0,local_140);
  uVar14 = 0xf;
  if (local_168 != &local_158) {
    uVar14 = local_158;
  }
  if (uVar14 < local_f0._M_string_length + local_160) {
    uVar17 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      uVar17 = local_f0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar17 < local_f0._M_string_length + local_160) goto LAB_00107c41;
    puVar10 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,(ulong)local_168);
  }
  else {
LAB_00107c41:
    puVar10 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_168,(ulong)local_f0._M_dataplus._M_p);
  }
  local_1b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = &local_198;
  pdVar1 = (double *)(puVar10 + 2);
  if ((double *)*puVar10 == pdVar1) {
    local_198 = *pdVar1;
    uStack_190 = puVar10[3];
  }
  else {
    local_198 = *pdVar1;
    local_1b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (double *)*puVar10;
  }
  local_1a0 = puVar10[1];
  *puVar10 = pdVar1;
  puVar10[1] = 0;
  *(undefined1 *)pdVar1 = 0;
  plVar9 = (long *)std::__cxx11::string::append
                             ((char *)&local_1b8.super__Vector_base<double,_std::allocator<double>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  lons_00 = (vector<double,_std::allocator<double>_> *)(plVar9 + 2);
  if ((vector<double,_std::allocator<double>_> *)*plVar9 == lons_00) {
    local_1b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (lons_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
    local_1b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)plVar9[3];
    local_1c8 = &local_1b8;
  }
  else {
    local_1b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (lons_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
    local_1c8 = (vector<double,_std::allocator<double>_> *)*plVar9;
  }
  local_1c0 = plVar9[1];
  *plVar9 = (long)lons_00;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  createLatLonListString_abi_cxx11_(&local_110,(MeteomaticsApiClient *)lats,lons,lons_00);
  pdVar15 = (pointer)0xf;
  if (local_1c8 != &local_1b8) {
    pdVar15 = local_1b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
  }
  if (pdVar15 < (pointer)(local_110._M_string_length + local_1c0)) {
    uVar17 = (pointer)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      uVar17 = local_110.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar17 < (pointer)(local_110._M_string_length + local_1c0)) goto LAB_00107d71;
    puVar10 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_110,0,(char *)0x0,(ulong)local_1c8);
  }
  else {
LAB_00107d71:
    puVar10 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_1c8,(ulong)local_110._M_dataplus._M_p);
  }
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  psVar2 = puVar10 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar2) {
    local_208.field_2._M_allocated_capacity = *psVar2;
    local_208.field_2._8_8_ = puVar10[3];
  }
  else {
    local_208.field_2._M_allocated_capacity = *psVar2;
    local_208._M_dataplus._M_p = (pointer)*puVar10;
  }
  local_208._M_string_length = puVar10[1];
  *puVar10 = psVar2;
  puVar10[1] = 0;
  *(undefined1 *)psVar2 = 0;
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_208);
  ppcVar4 = &local_1e8.mem.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  puVar12 = (ulong *)(plVar9 + 2);
  if ((pointer *)*plVar9 == (pointer *)puVar12) {
    local_1e8.mem.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)*puVar12;
    local_1e8.readPos = plVar9[3];
    local_1e8.mem.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)ppcVar4;
  }
  else {
    local_1e8.mem.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)*puVar12;
    local_1e8.mem.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)*plVar9;
  }
  local_1e8.mem.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)plVar9[1];
  *plVar9 = (long)puVar12;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  getOptionalSelectString(&local_130,optionals);
  pcVar16 = (pointer)0xf;
  if ((pointer *)
      local_1e8.mem.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != ppcVar4) {
    pcVar16 = local_1e8.mem.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  }
  if (pcVar16 < local_1e8.mem.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish + local_130._M_string_length) {
    uVar17 = (pointer)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      uVar17 = local_130.field_2._M_allocated_capacity;
    }
    if (local_1e8.mem.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_finish + local_130._M_string_length <= (ulong)uVar17) {
      puVar10 = (undefined8 *)
                std::__cxx11::string::replace
                          ((ulong)&local_130,0,(char *)0x0,
                           (ulong)local_1e8.mem.super__Vector_base<char,_std::allocator<char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
      goto LAB_00107eba;
    }
  }
  puVar10 = (undefined8 *)
            std::__cxx11::string::_M_append((char *)&local_1e8,(ulong)local_130._M_dataplus._M_p);
LAB_00107eba:
  local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
  psVar2 = puVar10 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar2) {
    local_188.field_2._M_allocated_capacity = *psVar2;
    local_188.field_2._8_8_ = puVar10[3];
  }
  else {
    local_188.field_2._M_allocated_capacity = *psVar2;
    local_188._M_dataplus._M_p = (pointer)*puVar10;
  }
  local_188._M_string_length = puVar10[1];
  *puVar10 = psVar2;
  puVar10[1] = 0;
  *(undefined1 *)psVar2 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p);
  }
  if ((pointer *)
      local_1e8.mem.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != ppcVar4) {
    operator_delete(local_1e8.mem.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  paVar5 = &local_208.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != paVar5) {
    operator_delete(local_208._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  if (local_1c8 != &local_1b8) {
    operator_delete(local_1c8);
  }
  if (local_1b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage != &local_198) {
    operator_delete(local_1b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  if (local_168 != &local_158) {
    operator_delete(local_168);
  }
  this_01 = local_148;
  if (local_70 != &local_60) {
    operator_delete(local_70);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  local_1c8 = (vector<double,_std::allocator<double>_> *)((ulong)local_1c8 & 0xffffffff00000000);
  MMIntern::MemoryClass::MemoryClass(&local_1e8,500);
  this_00 = this_01->httpClient;
  local_208._M_dataplus._M_p = (pointer)paVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"api.meteomatics.com","");
  MMIntern::HttpClient::requestBinary
            (this_00,&local_208,&local_188,&local_1e8,this_01->dataRequestTimeout,(int *)&local_1c8)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != paVar5) {
    operator_delete(local_208._M_dataplus._M_p);
  }
  iVar8 = (int)local_1c8;
  uVar3 = (int)local_1c8 - 200;
  if (uVar3 < 200) {
    if ((long)(lats->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(lats->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start == 8) {
      local_208._M_dataplus._M_p = (pointer)0x0;
      local_208._M_string_length = 0;
      local_208.field_2._M_allocated_capacity = 0;
      readSinglePointTimeSeriesBin(this_01,&local_1e8,(Matrix *)&local_208,times);
      std::
      vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
      ::push_back(result,(value_type *)&local_208);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 *)&local_208);
    }
    else {
      readMultiPointTimeSeriesBin(this_01,&local_1e8,result,times);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Http Error! Code: ",0x12);
    std::ostream::operator<<((ostream *)&std::cout,iVar8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,". For more information see returned msg string!",0x2f);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
    std::ostream::put(-0x58);
    std::ostream::flush();
    uVar14 = (long)local_1e8.mem.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_1e8.mem.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start;
    sVar13 = 0;
    if (uVar14 < local_1e8.readPos + uVar14) {
      sVar13 = local_1e8.readPos;
    }
    local_208._M_dataplus._M_p = (pointer)paVar5;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_208,
               (undefined1 *)
               ((long)local_1e8.mem.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start + local_1e8.readPos),
               (undefined1 *)
               ((long)local_1e8.mem.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start + local_1e8.readPos) + (uVar14 - sVar13));
    local_1e8.readPos = local_1e8.readPos + (uVar14 - sVar13);
    std::__cxx11::string::operator=((string *)msg,(string *)&local_208);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != paVar5) {
      operator_delete(local_208._M_dataplus._M_p);
    }
  }
  if ((pointer *)
      local_1e8.mem.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer *)0x0) {
    operator_delete(local_1e8.mem.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != &local_188.field_2) {
    operator_delete(local_188._M_dataplus._M_p);
  }
  return uVar3 < 200;
}

Assistant:

bool MeteomaticsApiClient::getMultiPointTimeSeries(const std::string& startTime, const std::string& stopTime, const std::string& timeStep, const std::vector<std::string>& parameters, std::vector<double> lats, std::vector<double> lons, std::vector<Matrix>& result, std::vector<std::string>& times, std::string& msg, const std::vector<std::string>& optionals) const
{
    result.clear();
    msg.clear();
    
    std::string queryString = "/" + startTime + "--" + stopTime + ":P" + timeStep
    + "/" + createParameterListString(parameters)
    + "/" + createLatLonListString(lats, lons)
    + "/bin"
    + getOptionalSelectString(optionals);
    
    int httpReturnCode = 0;
    
    MMIntern::MemoryClass mem(500);
    
    httpClient->requestBinary("api.meteomatics.com", queryString, mem, dataRequestTimeout, httpReturnCode);
    
    if (!MMIntern::http_code_success(httpReturnCode))
    {
        std::cout << "Http Error! Code: " << httpReturnCode;
        std::cout << ". For more information see returned msg string!" << std::endl;
        msg = mem.readString(mem.size());
        return false;
    }
    
    if (lats.size() == 1)
    {
        Matrix tmpM;
        if (!readSinglePointTimeSeriesBin(mem, tmpM, times))
        {
            std::cout << "Error while reading mem-object." << std::endl;
            return false;
        }
        result.push_back(tmpM);
    }
    else
    {
        if (!readMultiPointTimeSeriesBin(mem, result, times))
        {
            std::cout << "Error while reading mem-object." << std::endl;
            return false;
        }
    }
    return true;
}